

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztrigraph.cpp
# Opt level: O3

int __thiscall TPZGraphElT::NPoints(TPZGraphElT *this,TPZGraphNode *n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 1;
  iVar2 = 1 << ((byte)((this->super_TPZGraphEl).fGraphMesh)->fResolution & 0x1f);
  iVar1 = TPZGraphEl::ConnectNum(&this->super_TPZGraphEl,n);
  if (iVar1 - 3U < 3) {
    iVar3 = iVar2 + -1;
  }
  else if (iVar1 == 6) {
    iVar3 = ((iVar2 + -2) * (iVar2 + -1)) / 2;
  }
  return iVar3;
}

Assistant:

int TPZGraphElT::NPoints(TPZGraphNode *n){
	int res = fGraphMesh->Res();
	int imax = (1<<res);                                                                       
	int in = ConnectNum(n);
	switch(in) {
		case 0:
		case 1:
		case 2:
			return 1;
		case 3:
		case 4:
		case 5:
			return imax-1;
		case 6:
			return ((imax-1)*(imax-2))/2;
	}
	return 1;
}